

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O0

void __thiscall disp::h1(disp *this,string *s1)

{
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char in_stack_0000000f;
  string local_30 [48];
  
  std::operator+(in_stack_0000000f,unaff_retaddr);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void h1(std::string s1)	
	{ v_ = ':'+s1; }